

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertToLHProcess.cpp
# Opt level: O3

void __thiscall
Assimp::MakeLeftHandedProcess::ProcessNode
          (MakeLeftHandedProcess *this,aiNode *pNode,aiMatrix4x4 *pParentGlobalRotation)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  undefined4 uVar26;
  undefined4 uVar27;
  undefined4 uVar28;
  ulong uVar29;
  aiMatrix4x4t<float> temp;
  aiMatrix4x4 local_78;
  float local_38;
  float fStack_34;
  float fStack_30;
  float fStack_2c;
  
  uVar29._0_4_ = (pNode->mTransformation).c1;
  uVar29._4_4_ = (pNode->mTransformation).c2;
  (pNode->mTransformation).c1 = (float)(int)(uVar29 ^ 0x8000000080000000);
  (pNode->mTransformation).c2 = (float)(int)((uVar29 ^ 0x8000000080000000) >> 0x20);
  (pNode->mTransformation).c4 = -(pNode->mTransformation).c4;
  (pNode->mTransformation).a3 = -(pNode->mTransformation).a3;
  (pNode->mTransformation).b3 = -(pNode->mTransformation).b3;
  (pNode->mTransformation).d3 = -(pNode->mTransformation).d3;
  if (pNode->mNumChildren != 0) {
    uVar29 = 0;
    do {
      uVar13 = pParentGlobalRotation->a1;
      uVar14 = pParentGlobalRotation->a2;
      uVar15 = pParentGlobalRotation->a3;
      uVar16 = pParentGlobalRotation->a4;
      uVar17 = pParentGlobalRotation->b1;
      uVar18 = pParentGlobalRotation->b2;
      uVar19 = pParentGlobalRotation->b3;
      uVar20 = pParentGlobalRotation->b4;
      uVar21 = pParentGlobalRotation->c1;
      uVar22 = pParentGlobalRotation->c2;
      uVar23 = pParentGlobalRotation->c3;
      uVar24 = pParentGlobalRotation->c4;
      uVar25 = pParentGlobalRotation->d1;
      uVar26 = pParentGlobalRotation->d2;
      uVar27 = pParentGlobalRotation->d3;
      uVar28 = pParentGlobalRotation->d4;
      local_38 = (pNode->mTransformation).a1;
      fStack_34 = (pNode->mTransformation).a2;
      fStack_30 = (pNode->mTransformation).a3;
      fStack_2c = (pNode->mTransformation).a4;
      fVar1 = (pNode->mTransformation).b1;
      fVar2 = (pNode->mTransformation).b2;
      fVar3 = (pNode->mTransformation).b3;
      fVar4 = (pNode->mTransformation).b4;
      fVar5 = (pNode->mTransformation).c1;
      fVar6 = (pNode->mTransformation).c2;
      fVar7 = (pNode->mTransformation).c3;
      fVar8 = (pNode->mTransformation).c4;
      fVar9 = (pNode->mTransformation).d1;
      fVar10 = (pNode->mTransformation).d2;
      fVar11 = (pNode->mTransformation).d3;
      fVar12 = (pNode->mTransformation).d4;
      local_78.a2 = (float)uVar16 * fVar10 +
                    (float)uVar15 * fVar6 + (float)uVar13 * fStack_34 + (float)uVar14 * fVar2;
      local_78.a1 = (float)uVar16 * fVar9 +
                    (float)uVar15 * fVar5 + (float)uVar13 * local_38 + (float)uVar14 * fVar1;
      local_78.a4 = (float)uVar16 * fVar12 +
                    (float)uVar15 * fVar8 + (float)uVar13 * fStack_2c + (float)uVar14 * fVar4;
      local_78.a3 = (float)uVar16 * fVar11 +
                    (float)uVar15 * fVar7 + (float)uVar13 * fStack_30 + (float)uVar14 * fVar3;
      local_78.b2 = (float)uVar20 * fVar10 +
                    (float)uVar19 * fVar6 + (float)uVar17 * fStack_34 + (float)uVar18 * fVar2;
      local_78.b1 = (float)uVar20 * fVar9 +
                    (float)uVar19 * fVar5 + (float)uVar17 * local_38 + (float)uVar18 * fVar1;
      local_78.b4 = (float)uVar20 * fVar12 +
                    (float)uVar19 * fVar8 + (float)uVar17 * fStack_2c + (float)uVar18 * fVar4;
      local_78.b3 = (float)uVar20 * fVar11 +
                    (float)uVar19 * fVar7 + (float)uVar17 * fStack_30 + (float)uVar18 * fVar3;
      local_78.c2 = (float)uVar24 * fVar10 +
                    (float)uVar23 * fVar6 + (float)uVar21 * fStack_34 + (float)uVar22 * fVar2;
      local_78.c1 = (float)uVar24 * fVar9 +
                    (float)uVar23 * fVar5 + (float)uVar21 * local_38 + (float)uVar22 * fVar1;
      local_78.c4 = (float)uVar24 * fVar12 +
                    (float)uVar23 * fVar8 + (float)uVar21 * fStack_2c + (float)uVar22 * fVar4;
      local_78.c3 = (float)uVar24 * fVar11 +
                    (float)uVar23 * fVar7 + (float)uVar21 * fStack_30 + (float)uVar22 * fVar3;
      local_78.d2 = (float)uVar28 * fVar10 +
                    (float)uVar27 * fVar6 + (float)uVar25 * fStack_34 + (float)uVar26 * fVar2;
      local_78.d1 = (float)uVar28 * fVar9 +
                    (float)uVar27 * fVar5 + (float)uVar25 * local_38 + (float)uVar26 * fVar1;
      local_78.d4 = (float)uVar28 * fVar12 +
                    (float)uVar27 * fVar8 + (float)uVar25 * fStack_2c + (float)uVar26 * fVar4;
      local_78.d3 = (float)uVar28 * fVar11 +
                    (float)uVar27 * fVar7 + (float)uVar25 * fStack_30 + (float)uVar26 * fVar3;
      ProcessNode(this,pNode->mChildren[uVar29],&local_78);
      uVar29 = uVar29 + 1;
    } while (uVar29 < pNode->mNumChildren);
  }
  return;
}

Assistant:

void MakeLeftHandedProcess::ProcessNode( aiNode* pNode, const aiMatrix4x4& pParentGlobalRotation)
{
    // mirror all base vectors at the local Z axis
    pNode->mTransformation.c1 = -pNode->mTransformation.c1;
    pNode->mTransformation.c2 = -pNode->mTransformation.c2;
    pNode->mTransformation.c3 = -pNode->mTransformation.c3;
    pNode->mTransformation.c4 = -pNode->mTransformation.c4;

    // now invert the Z axis again to keep the matrix determinant positive.
    // The local meshes will be inverted accordingly so that the result should look just fine again.
    pNode->mTransformation.a3 = -pNode->mTransformation.a3;
    pNode->mTransformation.b3 = -pNode->mTransformation.b3;
    pNode->mTransformation.c3 = -pNode->mTransformation.c3;
    pNode->mTransformation.d3 = -pNode->mTransformation.d3; // useless, but anyways...

    // continue for all children
    for( size_t a = 0; a < pNode->mNumChildren; ++a ) {
        ProcessNode( pNode->mChildren[ a ], pParentGlobalRotation * pNode->mTransformation );
    }
}